

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal-inl.h
# Opt level: O1

int testing::internal::GetNextRandomSeed(int seed)

{
  int iVar1;
  ostream *poVar2;
  GTestLog local_14;
  
  if (0x1869e < seed - 1U) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/3rdparty/googletest/googletest/src/gtest-internal-inl.h"
                       ,0x96);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition 1 <= seed && seed <= kMaxRandomSeed failed. ",0x36);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Invalid random seed ",0x14);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,seed);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," - must be in [1, ",0x12);
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,99999);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,"].",2);
    GTestLog::~GTestLog(&local_14);
  }
  iVar1 = 1;
  if (seed < 99999) {
    iVar1 = seed + 1;
  }
  return iVar1;
}

Assistant:

inline int GetNextRandomSeed(int seed) {
  GTEST_CHECK_(1 <= seed && seed <= kMaxRandomSeed)
      << "Invalid random seed " << seed << " - must be in [1, "
      << kMaxRandomSeed << "].";
  const int next_seed = seed + 1;
  return (next_seed > kMaxRandomSeed) ? 1 : next_seed;
}